

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkFragmentShadingRateAttachmentInfoKHR *create_info,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  bool bVar1;
  GenericStringRef<char> local_b0;
  uint local_9c;
  undefined1 local_98 [8];
  Value att;
  GenericStringRef<char> local_78;
  GenericStringRef<char> local_68;
  undefined1 local_58 [8];
  Value extent;
  undefined1 local_38 [8];
  Value value;
  Value *out_value_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc_local;
  VkFragmentShadingRateAttachmentInfoKHR *create_info_local;
  
  value.data_.o.members = (Member *)out_value;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_38,kObjectType);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>
            ((GenericStringRef<char> *)((long)&extent.data_ + 8),(char (*) [6])0x3cdd46);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkStructureType>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_38,(StringRefType *)((long)&extent.data_ + 8),create_info->sType,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_58,kObjectType);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_68,(char (*) [6])0x3e1764);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_58,&local_68,(create_info->shadingRateAttachmentTexelSize).width,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_78,(char (*) [7])0x3cb69e);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_58,&local_78,(create_info->shadingRateAttachmentTexelSize).height,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<31u>
            ((GenericStringRef<char> *)((long)&att.data_ + 8),
             (char (*) [31])"shadingRateAttachmentTexelSize");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_38,(StringRefType *)((long)&att.data_ + 8),
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_58,alloc);
  if (create_info->pFragmentShadingRateAttachment != (VkAttachmentReference2 *)0x0) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_98);
    bVar1 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      (create_info->pFragmentShadingRateAttachment,alloc,(Value *)local_98);
    if (bVar1) {
      rapidjson::GenericStringRef<char>::GenericStringRef<30u>
                (&local_b0,(char (*) [30])"fragmentShadingRateAttachment");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_38,&local_b0,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_98,alloc);
    }
    else {
      create_info_local._7_1_ = 0;
    }
    local_9c = (uint)!bVar1;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_98);
    if (local_9c != 0) goto LAB_001c5a13;
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  operator=(value.data_.a.elements,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_38);
  create_info_local._7_1_ = 1;
  local_9c = 1;
LAB_001c5a13:
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)local_58);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)local_38);
  return (bool)(create_info_local._7_1_ & 1);
}

Assistant:

static bool json_value(const VkFragmentShadingRateAttachmentInfoKHR &create_info, Allocator &alloc, Value *out_value)
{
	Value value(kObjectType);
	value.AddMember("sType", create_info.sType, alloc);

	Value extent(kObjectType);
	extent.AddMember("width", create_info.shadingRateAttachmentTexelSize.width, alloc);
	extent.AddMember("height", create_info.shadingRateAttachmentTexelSize.height, alloc);
	value.AddMember("shadingRateAttachmentTexelSize", extent, alloc);
	if (create_info.pFragmentShadingRateAttachment)
	{
		Value att;
		if (!json_value(*create_info.pFragmentShadingRateAttachment, alloc, &att))
			return false;
		value.AddMember("fragmentShadingRateAttachment", att, alloc);
	}
	*out_value = value;
	return true;
}